

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bindings.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  long lVar1;
  char *__assertion;
  eid id;
  undefined1 local_28 [16];
  i injector;
  
  injector.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .
  super_scope<interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_int>
  .object_.id = (dependency<boost::ext::di::v1_3_0::scopes::instance,_interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                 )&id;
  id = e1;
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
  ::create<std::shared_ptr<interface>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
              *)local_28);
  if ((eid *)local_28._0_8_ != (eid *)0x0) {
    lVar1 = __dynamic_cast(local_28._0_8_,&interface::typeinfo,&implementation1::typeinfo,0);
    if (lVar1 != 0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
      id = e2;
      boost::ext::di::v1_3_0::core::
      injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
      ::create<std::shared_ptr<interface>,_0>
                ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
                  *)local_28);
      if ((scope<interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_int>
           )local_28._0_8_ != (eid *)0x0) {
        lVar1 = __dynamic_cast(local_28._0_8_,&interface::typeinfo,&implementation2::typeinfo,0);
        if (lVar1 != 0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
          return 0;
        }
      }
      __assertion = 
      "dynamic_cast<implementation2*>(injector.create<std::shared_ptr<interface>>().get())";
      __line = 0x33;
      goto LAB_001012eb;
    }
  }
  __assertion = 
  "dynamic_cast<implementation1*>(injector.create<std::shared_ptr<interface>>().get())";
  __line = 0x2f;
LAB_001012eb:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/dynamic_bindings.cpp"
                ,__line,"int main()");
}

Assistant:

int main() {
  auto id = e1;

  /*<<create interface with `id = e1`>>*/
  auto injector = di::make_injector(dynamic_bindings(id));
  assert(dynamic_cast<implementation1*>(injector.create<std::shared_ptr<interface>>().get()));

  id = e2;
  /*<<create interface with `id = e2`>>*/
  assert(dynamic_cast<implementation2*>(injector.create<std::shared_ptr<interface>>().get()));
  (void)id;
}